

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O3

void __thiscall
defyx::AssemblyGeneratorX86::h_IROL_R(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  byte bVar1;
  char *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  
  bVar1 = instr->dst;
  this->registerUsage[bVar1] = i;
  poVar4 = (ostream *)&this->field_0x10;
  if (instr->src == bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\trol ",5);
    pcVar2 = *(char **)(regR + (ulong)instr->dst * 8);
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar2,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tmov ecx, ",10);
    pcVar2 = *(char **)(regR32 + (ulong)instr->src * 8);
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar2,sVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\trol ",5);
    pcVar2 = *(char **)(regR + (ulong)instr->dst * 8);
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar2,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", cl",4);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void AssemblyGeneratorX86::h_IROL_R(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		if (instr.src != instr.dst) {
			asmCode << "\tmov ecx, " << regR32[instr.src] << std::endl;
			asmCode << "\trol " << regR[instr.dst] << ", cl" << std::endl;
		}
		else {
			asmCode << "\trol " << regR[instr.dst] << ", " << (instr.getImm32() & 63) << std::endl;
		}
		traceint(instr);
	}